

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqllogic_command.cpp
# Opt level: O1

void __thiscall duckdb::LoopCommand::ExecuteInternal(LoopCommand *this,ExecuteContext *context)

{
  undefined4 uVar1;
  pointer pcVar2;
  undefined4 uVar5;
  undefined8 uVar3;
  pointer puVar4;
  int iVar6;
  pointer pLVar7;
  pointer pCVar8;
  _Node *p_Var9;
  _Node *p_Var10;
  runtime_error *prVar11;
  _List_node_base *p_Var12;
  _List_node_base *p_Var13;
  unique_ptr<duckdb::Command,_std::default_delete<duckdb::Command>,_true> *statement;
  pointer puVar14;
  LoopDefinition loop_def;
  list<duckdb::ParallelExecuteContext,_std::allocator<duckdb::ParallelExecuteContext>_> contexts;
  list<std::thread,_std::allocator<std::thread>_> threads;
  AssertionHandler catchAssertionHandler;
  ReusableStringStream local_138;
  string local_120;
  value_type local_100;
  _List_base<duckdb::ParallelExecuteContext,_std::allocator<duckdb::ParallelExecuteContext>_>
  local_b8;
  _List_base<std::thread,_std::allocator<std::thread>_> local_a0;
  StringRef local_88;
  AssertionHandler local_78;
  
  local_100.loop_iterator_name._M_dataplus._M_p = (pointer)&local_100.loop_iterator_name.field_2;
  pcVar2 = (this->definition).loop_iterator_name._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_100,pcVar2,
             pcVar2 + (this->definition).loop_iterator_name._M_string_length);
  uVar1 = (this->definition).loop_idx;
  uVar5 = (this->definition).loop_start;
  uVar3 = *(undefined8 *)((long)&(this->definition).loop_start + 1);
  local_100.loop_end = (int)((ulong)uVar3 >> 0x18);
  local_100.is_parallel = SUB81((ulong)uVar3 >> 0x38,0);
  local_100.loop_idx = uVar1;
  local_100.loop_start = uVar5;
  Catch::clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_100.tokens,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&(this->definition).tokens);
  local_100.loop_idx = (this->definition).loop_start;
  if (local_100.is_parallel == false) {
    do {
      if (((((this->super_Command).runner)->finished_processing_file)._M_base._M_i & 1U) != 0)
      break;
      std::vector<duckdb::LoopDefinition,_std::allocator<duckdb::LoopDefinition>_>::push_back
                (&(context->running_loops).
                  super_vector<duckdb::LoopDefinition,_std::allocator<duckdb::LoopDefinition>_>,
                 &local_100);
      puVar4 = (this->loop_commands).
               super_vector<duckdb::unique_ptr<duckdb::Command,_std::default_delete<duckdb::Command>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Command,_std::default_delete<duckdb::Command>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::Command,_std::default_delete<duckdb::Command>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Command,_std::default_delete<duckdb::Command>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (puVar14 = (this->loop_commands).
                     super_vector<duckdb::unique_ptr<duckdb::Command,_std::default_delete<duckdb::Command>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Command,_std::default_delete<duckdb::Command>,_true>_>_>
                     .
                     super__Vector_base<duckdb::unique_ptr<duckdb::Command,_std::default_delete<duckdb::Command>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Command,_std::default_delete<duckdb::Command>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; puVar14 != puVar4;
          puVar14 = puVar14 + 1) {
        pCVar8 = unique_ptr<duckdb::Command,_std::default_delete<duckdb::Command>,_true>::operator->
                           (puVar14);
        Command::Execute(pCVar8,context);
      }
      std::vector<duckdb::LoopDefinition,_std::allocator<duckdb::LoopDefinition>_>::pop_back
                (&(context->running_loops).
                  super_vector<duckdb::LoopDefinition,_std::allocator<duckdb::LoopDefinition>_>);
      local_100.loop_idx = local_100.loop_idx + 1;
    } while (local_100.loop_idx < local_100.loop_end);
  }
  else {
    for (pLVar7 = (context->running_loops).
                  super_vector<duckdb::LoopDefinition,_std::allocator<duckdb::LoopDefinition>_>.
                  super__Vector_base<duckdb::LoopDefinition,_std::allocator<duckdb::LoopDefinition>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pLVar7 != (context->running_loops).
                  super_vector<duckdb::LoopDefinition,_std::allocator<duckdb::LoopDefinition>_>.
                  super__Vector_base<duckdb::LoopDefinition,_std::allocator<duckdb::LoopDefinition>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pLVar7 = pLVar7 + 1) {
      if (pLVar7->is_parallel == true) {
        prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar11,"Nested parallel loop commands not allowed");
        __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    puVar4 = (this->loop_commands).
             super_vector<duckdb::unique_ptr<duckdb::Command,_std::default_delete<duckdb::Command>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Command,_std::default_delete<duckdb::Command>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::Command,_std::default_delete<duckdb::Command>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Command,_std::default_delete<duckdb::Command>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar14 = (this->loop_commands).
                   super_vector<duckdb::unique_ptr<duckdb::Command,_std::default_delete<duckdb::Command>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Command,_std::default_delete<duckdb::Command>,_true>_>_>
                   .
                   super__Vector_base<duckdb::unique_ptr<duckdb::Command,_std::default_delete<duckdb::Command>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Command,_std::default_delete<duckdb::Command>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar14 != puVar4;
        puVar14 = puVar14 + 1) {
      pCVar8 = unique_ptr<duckdb::Command,_std::default_delete<duckdb::Command>,_true>::operator->
                         (puVar14);
      iVar6 = (*pCVar8->_vptr_Command[3])(pCVar8);
      if ((char)iVar6 == '\0') {
        prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error
                  (prVar11,"Concurrent loop is not supported over this command");
        __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    local_b8._M_impl._M_node._M_size = 0;
    local_b8._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_b8;
    local_b8._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_b8;
    do {
      p_Var9 = std::__cxx11::
               list<duckdb::ParallelExecuteContext,std::allocator<duckdb::ParallelExecuteContext>>::
               _M_create_node<duckdb::SQLLogicTestRunner&,duckdb::vector<duckdb::unique_ptr<duckdb::Command,std::default_delete<duckdb::Command>,true>,true>const&,duckdb::LoopDefinition&>
                         ((list<duckdb::ParallelExecuteContext,std::allocator<duckdb::ParallelExecuteContext>>
                           *)&local_b8,(this->super_Command).runner,&this->loop_commands,&local_100)
      ;
      std::__detail::_List_node_base::_M_hook(&p_Var9->super__List_node_base);
      local_b8._M_impl._M_node._M_size = local_b8._M_impl._M_node._M_size + 1;
      local_100.loop_idx = local_100.loop_idx + 1;
    } while (local_100.loop_idx < local_100.loop_end);
    local_a0._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_a0;
    local_a0._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_a0;
    local_a0._M_impl._M_node._M_size = 0;
    p_Var12 = (_List_node_base *)&local_a0;
    if (local_b8._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_b8) {
      p_Var13 = local_b8._M_impl._M_node.super__List_node_base._M_next;
      do {
        local_78.m_assertionInfo.macroName.m_start = (char *)(p_Var13 + 1);
        p_Var10 = std::__cxx11::list<std::thread,std::allocator<std::thread>>::
                  _M_create_node<void(&)(duckdb::ParallelExecuteContext*),duckdb::ParallelExecuteContext*>
                            ((list<std::thread,std::allocator<std::thread>> *)&local_a0,
                             ParallelExecuteLoop,(ParallelExecuteContext **)&local_78);
        std::__detail::_List_node_base::_M_hook(&p_Var10->super__List_node_base);
        local_a0._M_impl._M_node._M_size = local_a0._M_impl._M_node._M_size + 1;
        p_Var13 = p_Var13->_M_next;
      } while (p_Var13 != (_List_node_base *)&local_b8);
    }
    while (p_Var12 = (((_List_impl *)&p_Var12->_M_next)->_M_node).super__List_node_base._M_next,
          p_Var12 != (_List_node_base *)&local_a0) {
      std::thread::join();
    }
    if (local_b8._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_b8) {
      p_Var12 = local_b8._M_impl._M_node.super__List_node_base._M_next;
      do {
        if (((ulong)p_Var12[6]._M_prev & 1) == 0) {
          if (p_Var12[7]._M_prev == (_List_node_base *)0x0) {
            local_120._M_dataplus._M_p = "FAIL";
            local_120._M_string_length = 4;
            local_138.super_NonCopyable._vptr_NonCopyable = (_func_int **)p_Var12[9]._M_next;
            local_138.m_index = (size_t)*(int *)&p_Var12[0xb]._M_next;
            Catch::AssertionHandler::AssertionHandler
                      (&local_78,(StringRef *)&local_120,(SourceLineInfo *)&local_138,
                       (StringRef)ZEXT816(0x4fcc85),Normal);
            local_138.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x0;
            local_138.m_index = 0;
            local_138.m_oss = (ostream *)0x0;
            Catch::ReusableStringStream::ReusableStringStream(&local_138);
            std::ostream::operator<<(local_138.m_oss,0);
            Catch::ReusableStringStream::str_abi_cxx11_(&local_120,&local_138);
            local_88.m_start = local_120._M_dataplus._M_p;
            local_88.m_size = local_120._M_string_length;
            Catch::AssertionHandler::handleMessage(&local_78,ExplicitFailure,&local_88);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_120._M_dataplus._M_p != &local_120.field_2) {
              operator_delete(local_120._M_dataplus._M_p);
            }
            Catch::ReusableStringStream::~ReusableStringStream(&local_138);
            Catch::AssertionHandler::complete(&local_78);
            if (local_78.m_completed == false) {
              (*(local_78.m_resultCapture)->_vptr_IResultCapture[0x11])
                        (local_78.m_resultCapture,&local_78);
            }
          }
          else {
            local_120._M_dataplus._M_p = "FAIL";
            local_120._M_string_length = 4;
            local_138.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x4eea25;
            local_138.m_index = 0x13e;
            Catch::AssertionHandler::AssertionHandler
                      (&local_78,(StringRef *)&local_120,(SourceLineInfo *)&local_138,
                       (StringRef)ZEXT816(0x4fcc85),Normal);
            local_138.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x0;
            local_138.m_index = 0;
            local_138.m_oss = (ostream *)0x0;
            Catch::ReusableStringStream::ReusableStringStream(&local_138);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_138.m_oss,(char *)p_Var12[7]._M_next,
                       (long)p_Var12[7]._M_prev);
            Catch::ReusableStringStream::str_abi_cxx11_(&local_120,&local_138);
            local_88.m_start = local_120._M_dataplus._M_p;
            local_88.m_size = local_120._M_string_length;
            Catch::AssertionHandler::handleMessage(&local_78,ExplicitFailure,&local_88);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_120._M_dataplus._M_p != &local_120.field_2) {
              operator_delete(local_120._M_dataplus._M_p);
            }
            Catch::ReusableStringStream::~ReusableStringStream(&local_138);
            Catch::AssertionHandler::complete(&local_78);
            if (local_78.m_completed == false) {
              (*(local_78.m_resultCapture)->_vptr_IResultCapture[0x11])
                        (local_78.m_resultCapture,&local_78);
            }
          }
        }
        p_Var12 = p_Var12->_M_next;
      } while (p_Var12 != (_List_node_base *)&local_b8);
    }
    std::__cxx11::_List_base<std::thread,_std::allocator<std::thread>_>::_M_clear(&local_a0);
    std::__cxx11::
    _List_base<duckdb::ParallelExecuteContext,_std::allocator<duckdb::ParallelExecuteContext>_>::
    _M_clear(&local_b8);
  }
  Catch::clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_100.tokens);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.loop_iterator_name._M_dataplus._M_p != &local_100.loop_iterator_name.field_2) {
    operator_delete(local_100.loop_iterator_name._M_dataplus._M_p);
  }
  return;
}

Assistant:

void LoopCommand::ExecuteInternal(ExecuteContext &context) const {
	LoopDefinition loop_def = definition;
	loop_def.loop_idx = definition.loop_start;
	if (loop_def.is_parallel) {
		for (auto &running_loop : context.running_loops) {
			if (running_loop.is_parallel) {
				throw std::runtime_error("Nested parallel loop commands not allowed");
			}
		}
		for (auto &command : loop_commands) {
			if (!command->SupportsConcurrent()) {
				throw std::runtime_error("Concurrent loop is not supported over this command");
			}
		}
		// parallel loop: launch threads
		std::list<ParallelExecuteContext> contexts;
		while (true) {
			contexts.emplace_back(runner, loop_commands, loop_def);
			loop_def.loop_idx++;
			if (loop_def.loop_idx >= loop_def.loop_end) {
				// finished
				break;
			}
		}
		std::list<std::thread> threads;
		for (auto &context : contexts) {
			threads.emplace_back(ParallelExecuteLoop, &context);
		}
		for (auto &thread : threads) {
			thread.join();
		}
		for (auto &context : contexts) {
			if (!context.success) {
				if (!context.error_message.empty()) {
					FAIL(context.error_message);
				} else {
					FAIL_LINE(context.error_file, context.error_line, 0);
				}
			}
		}
	} else {
		bool finished = false;
		while (!finished && !runner.finished_processing_file) {
			// execute the current iteration of the loop
			context.running_loops.push_back(loop_def);
			for (auto &statement : loop_commands) {
				statement->Execute(context);
			}
			context.running_loops.pop_back();
			loop_def.loop_idx++;
			if (loop_def.loop_idx >= loop_def.loop_end) {
				// finished
				break;
			}
		}
	}
}